

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_array_ref.hpp
# Opt level: O2

void __thiscall
boost::
const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
::init_from_extent_gen
          (const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
           *this,extent_gen<2UL> *ranges)

{
  extent_list extents;
  const_mem_fun_ref_t<unsigned_long,_boost::detail::multi_array::extent_range<long,_unsigned_long>_>
  in_stack_ffffffffffffffc8;
  
  std::
  transform<boost::detail::multi_array::extent_range<long,unsigned_long>const*,long*,boost::const_mem_fun_ref_t<long,boost::detail::multi_array::extent_range<long,unsigned_long>>>
            ((extent_range<long,_unsigned_long> *)ranges,
             (extent_range<long,_unsigned_long> *)(ranges + 1),(this->index_base_list_).elems,
             (const_mem_fun_ref_t<long,_boost::detail::multi_array::extent_range<long,_unsigned_long>_>
              )in_stack_ffffffffffffffc8);
  std::
  transform<boost::detail::multi_array::extent_range<long,unsigned_long>const*,long*,boost::const_mem_fun_ref_t<unsigned_long,boost::detail::multi_array::extent_range<long,unsigned_long>>>
            ((extent_range<long,_unsigned_long> *)ranges,
             (extent_range<long,_unsigned_long> *)(ranges + 1),(long *)&stack0xffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
  ::init_multi_array_ref<long*>
            ((const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
              *)this,(long *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void init_from_extent_gen(const
                        detail::multi_array::
                        extent_gen<NumDims>& ranges) { 
    
    typedef boost::array<index,NumDims> extent_list;

    // get the index_base values
    std::transform(ranges.ranges_.begin(),ranges.ranges_.end(),
              index_base_list_.begin(),
              boost::mem_fun_ref(&extent_range::start));

    // calculate the extents
    extent_list extents;
    std::transform(ranges.ranges_.begin(),ranges.ranges_.end(),
              extents.begin(),
              boost::mem_fun_ref(&extent_range::size));

    init_multi_array_ref(extents.begin());
  }